

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::computeTest(SPxSolverBase<double> *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Verbosity VVar4;
  double *pdVar5;
  int *piVar6;
  streamsize sVar7;
  SPxOut *_spxout;
  SPxOut *_spxout_00;
  long in_RDI;
  double dVar8;
  streamsize prec;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Status stat;
  int i;
  int sparsitythreshold;
  double pricingTol;
  Desc *ds;
  SPxSolverBase<double> *in_stack_ffffffffffffff68;
  SPxSolverBase<double> *in_stack_ffffffffffffff70;
  Status in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 local_34;
  Verbosity local_30 [3];
  Status local_24;
  int local_20;
  int local_1c;
  double local_18;
  Desc *local_10;
  
  local_10 = SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  local_18 = leavetol(in_stack_ffffffffffffff68);
  *(undefined1 *)(in_RDI + 0x368) = 1;
  *(undefined8 *)(in_RDI + 0x360) = 0;
  IdxSet::clear((IdxSet *)(in_RDI + 0x808));
  dVar8 = *(double *)(in_RDI + 0x420);
  iVar2 = coDim((SPxSolverBase<double> *)0x23ba0e);
  local_1c = (int)(dVar8 * (double)iVar2);
  for (local_20 = 0; iVar2 = local_20, iVar3 = coDim((SPxSolverBase<double> *)0x23ba3e),
      iVar2 < iVar3; local_20 = local_20 + 1) {
    local_24 = SPxBasisBase<double>::Desc::status
                         ((Desc *)in_stack_ffffffffffffff70,
                          (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    bVar1 = isBasic(in_stack_ffffffffffffff70,(Status)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    if (bVar1) {
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff70,
                          (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      *pdVar5 = 0.0;
      if (*(int *)(in_RDI + 0x8a8) == 0) {
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x880),local_20);
        *piVar6 = 0;
      }
    }
    else {
      dVar8 = test((SPxSolverBase<double> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff70,
                          (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      *pdVar5 = dVar8;
      iVar2 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      if (*(int *)(in_RDI + 0x8a8) == 0) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar2);
        if (-local_18 <= *pdVar5) {
          piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x880),local_20);
          *piVar6 = 0;
        }
        else {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          *(double *)(in_RDI + 0x360) = *(double *)(in_RDI + 0x360) - *pdVar5;
          DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffff70,
                          (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x880),local_20);
          *piVar6 = 1;
          *(int *)(in_RDI + 0x36c) = *(int *)(in_RDI + 0x36c) + 1;
        }
        iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x808));
        if (local_1c < iVar2) {
          if ((*(long *)(in_RDI + 0x918) != 0) &&
             (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918)), 3 < (int)VVar4)) {
            local_30[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918));
            local_30[1] = 4;
            (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))
                      (*(long **)(in_RDI + 0x918),local_30 + 1);
            soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68
                              );
            soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,
                               (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffff68);
            (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))
                      (*(long **)(in_RDI + 0x918),local_30 + 2);
          }
          *(undefined4 *)(in_RDI + 0x8a8) = 5;
          *(undefined1 *)(in_RDI + 0x89a) = 0;
          IdxSet::clear((IdxSet *)(in_RDI + 0x808));
        }
      }
      else {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff70,iVar2);
        if (*pdVar5 < -local_18) {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff70,
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          *(double *)(in_RDI + 0x360) = *(double *)(in_RDI + 0x360) - *pdVar5;
          *(int *)(in_RDI + 0x36c) = *(int *)(in_RDI + 0x36c) + 1;
        }
      }
    }
  }
  iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x808));
  if ((iVar2 == 0) && ((*(byte *)(in_RDI + 0x89a) & 1) == 0)) {
    *(int *)(in_RDI + 0x8a8) = *(int *)(in_RDI + 0x8a8) + -1;
  }
  else {
    iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x808));
    if ((iVar2 <= local_1c) && ((*(byte *)(in_RDI + 0x89a) & 1) == 0)) {
      if ((*(long *)(in_RDI + 0x918) != 0) &&
         (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918)), 3 < (int)VVar4)) {
        local_30[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918));
        local_34 = 4;
        (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))(*(long **)(in_RDI + 0x918),&local_34);
        sVar7 = SPxOut::precision((SPxOut *)0x23be42);
        if ((*(byte *)(in_RDI + 0x89c) & 1) == 0) {
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
        }
        else {
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
        }
        _spxout = soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,
                                     (char *)in_stack_ffffffffffffff68);
        std::setw(6);
        soplex::operator<<(_spxout,(_Setw)(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        _spxout_00 = soplex::operator<<((SPxOut *)in_stack_ffffffffffffff70,
                                        (_func_ios_base_ptr_ios_base_ptr *)_spxout);
        std::setprecision(4);
        soplex::operator<<(_spxout,(_Setprecision)(int)((ulong)_spxout_00 >> 0x20));
        IdxSet::size((IdxSet *)(in_RDI + 0x808));
        coDim((SPxSolverBase<double> *)0x23bf1b);
        soplex::operator<<(_spxout_00,(double)_spxout);
        soplex::operator<<(_spxout_00,(_func_ios_base_ptr_ios_base_ptr *)_spxout);
        std::setprecision((int)sVar7);
        soplex::operator<<(_spxout,(_Setprecision)(int)((ulong)_spxout_00 >> 0x20));
        soplex::operator<<(_spxout_00,(_func_ostream_ptr_ostream_ptr *)_spxout);
        (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))(*(long **)(in_RDI + 0x918),local_30);
      }
      *(undefined1 *)(in_RDI + 0x89a) = 1;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}